

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::add_cell_index_to_cache_t::operator()
          (add_cell_index_to_cache_t *this,vertex_index_t *first_vertex,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int in_EDX;
  undefined8 *in_RDI;
  directed_flag_complex_cell_t cell;
  vertex_index_t *c;
  unsigned_short *in_stack_ffffffffffffffa0;
  pair<directed_flag_complex_cell_t,_int> *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  directed_flag_complex_cell_t local_30;
  vertex_index_t *local_20;
  int local_14;
  
  *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar2 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_14 = in_EDX;
  local_20 = (vertex_index_t *)operator_new__(uVar2);
  std::copy<unsigned_short*,unsigned_short*>
            ((unsigned_short *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
             (unsigned_short *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_30,local_20);
  cell_hasher_t::set_current_cell_dimension((short)local_14 - 1);
  std::make_pair<directed_flag_complex_cell_t&,int&>
            (&in_stack_ffffffffffffffa8->first,(int *)*in_RDI);
  std::
  unordered_map<directed_flag_complex_cell_t,unsigned_long,cell_hasher_t,cell_comparer_t,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>>
  ::insert<std::pair<directed_flag_complex_cell_t,int>>
            ((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
              *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;

		// Save the cell vertices on the heap
		vertex_index_t* c = new vertex_index_t[size];
		std::copy(first_vertex, first_vertex + size, c);

		directed_flag_complex_cell_t cell(c);
		cell_hasher_t::set_current_cell_dimension(size - 1);

		cache.insert(std::make_pair(cell, current_index));
	}